

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void wide_bit_sum(RK_U8 *data,RK_U32 len,RK_ULONG *sum)

{
  RK_ULONG RVar1;
  ulong uVar2;
  
  if (3 < len) {
    RVar1 = *sum;
    uVar2 = 0;
    do {
      RVar1 = RVar1 + *(uint *)(data + uVar2 * 4);
      uVar2 = uVar2 + 1;
    } while (len >> 2 != uVar2);
    *sum = RVar1;
  }
  if ((len & 3) != 0) {
    RVar1 = *sum;
    uVar2 = (ulong)(len & 0xfffffffc);
    do {
      RVar1 = RVar1 + data[uVar2];
      *sum = RVar1;
      uVar2 = uVar2 + 1;
    } while (uVar2 < len);
  }
  return;
}

Assistant:

void wide_bit_sum(RK_U8 *data, RK_U32 len, RK_ULONG *sum)
{
    RK_U8   *data8 = NULL;
    RK_U32  loop;
    data8 = data;
#if LONG_MAX == INT_MAX
    RK_U16 *data_rk = NULL;
    data_rk = (RK_U16 *)data;
#else
    RK_U32 *data_rk = NULL;
    data_rk = (RK_U32 *)data;
#endif

    for (loop = 0; loop < len / CAL_BYTE; loop++) {
        *sum += data_rk[loop];
    }
    for (loop = len / CAL_BYTE * CAL_BYTE; loop < len; loop++) {
        *sum += data8[loop];
    }

    return;
}